

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenHexNum(Lexer *this)

{
  int iVar1;
  Lexer *in_RSI;
  size_t num;
  Lexer *this_local;
  
  nextChar(in_RSI);
  while (iVar1 = isxdigit(in_RSI->currentChar), iVar1 != 0) {
    isdigit(in_RSI->currentChar);
    nextChar(in_RSI);
  }
  nextTokenNumType(this,(uint64_t)in_RSI);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenHexNum() noexcept {
  nextChar(); // eat x

  size_t num = 0;
  while (std::isxdigit(currentChar)) {
    num *= 16;
    if (std::isdigit(currentChar))
      num += currentChar - '0';
    else
      num += currentChar - 'A' + 10;
    nextChar(); // eat hexadecimal digit
  }

  return nextTokenNumType(num);
}